

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsInputOutput.cpp
# Opt level: O2

void chrono::utils::ReadCheckpoint(ChSystem *system,string *filename)

{
  char *pcVar1;
  element_type *peVar2;
  element_type *peVar3;
  uint uVar4;
  int iVar5;
  istream *piVar6;
  void *pvVar7;
  undefined4 extraout_var;
  ostream *poVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  shared_ptr<chrono::ChMaterialSurfaceSMC> matSMC;
  shared_ptr<chrono::ChBody> body;
  double height;
  int ctype;
  short family_mask;
  short family_group;
  shared_ptr<chrono::ChMaterialSurface> mat;
  ChVector<double> spos;
  double dummy;
  int stype;
  int n_shapes;
  int bcollide;
  int bfixed;
  int bid;
  ChQuaternion<double> srot;
  ChVector<double> bpos;
  string line;
  ChVector<double> bpos_dt;
  ChVector<double> inertiaXX;
  double mass;
  ChQuaternion<double> brot_dt;
  ChQuaternion<double> brot;
  shared_ptr<chrono::ChVisualMaterial> local_950;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_940;
  shared_ptr<chrono::ChVisualMaterial> local_930;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_920;
  shared_ptr<chrono::ChVisualMaterial> local_910;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_900;
  shared_ptr<chrono::ChVisualMaterial> local_8f0;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_8e0;
  shared_ptr<chrono::ChVisualMaterial> local_8d0;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_8c0;
  shared_ptr<chrono::ChVisualMaterial> local_8b0;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_8a0;
  shared_ptr<chrono::ChVisualMaterial> local_890;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_880;
  shared_ptr<chrono::ChVisualMaterial> local_870;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_860;
  __shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2> local_850;
  double dummy_1;
  istringstream iss;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_830 [47];
  istringstream iss1;
  ifstream ifile;
  istringstream iss0;
  istringstream iss3;
  
  std::ifstream::ifstream((istream *)&ifile,(filename->_M_dataplus)._M_p,_S_in);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&ifile,(string *)&line);
  std::__cxx11::istringstream::istringstream((istringstream *)&iss0,(string *)&line,_S_in);
  std::istream::operator>>(&iss0,&ctype);
  iVar5 = ctype;
  uVar4 = (*(system->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x2f])();
  if (uVar4 == (iVar5 != 0)) {
    while( true ) {
      piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&ifile,(string *)&line);
      if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) break;
      std::__cxx11::istringstream::istringstream((istringstream *)&iss1,(string *)&line,_S_in);
      pvVar7 = (void *)std::istream::operator>>((istringstream *)&iss1,&bid);
      pvVar7 = (void *)std::istream::operator>>(pvVar7,&bfixed);
      pvVar7 = (void *)std::istream::operator>>(pvVar7,&bcollide);
      pvVar7 = (void *)std::istream::operator>>(pvVar7,&family_group);
      std::istream::operator>>(pvVar7,&family_mask);
      inertiaXX.m_data[2] = 0.0;
      inertiaXX.m_data[0] = 0.0;
      inertiaXX.m_data[1] = 0.0;
      piVar6 = std::istream::_M_extract<double>((double *)&iss1);
      piVar6 = std::istream::_M_extract<double>((double *)piVar6);
      piVar6 = std::istream::_M_extract<double>((double *)piVar6);
      std::istream::_M_extract<double>((double *)piVar6);
      bpos.m_data[2] = 0.0;
      bpos_dt.m_data[2] = 0.0;
      bpos.m_data[0] = 0.0;
      bpos.m_data[1] = 0.0;
      bpos_dt.m_data[0] = 0.0;
      bpos_dt.m_data[1] = 0.0;
      brot_dt.m_data = (double  [4])(ZEXT432(0) << 0x40);
      brot.m_data = brot_dt.m_data;
      piVar6 = std::istream::_M_extract<double>((double *)&iss1);
      piVar6 = std::istream::_M_extract<double>((double *)piVar6);
      std::istream::_M_extract<double>((double *)piVar6);
      piVar6 = std::istream::_M_extract<double>((double *)&iss1);
      piVar6 = std::istream::_M_extract<double>((double *)piVar6);
      piVar6 = std::istream::_M_extract<double>((double *)piVar6);
      std::istream::_M_extract<double>((double *)piVar6);
      piVar6 = std::istream::_M_extract<double>((double *)&iss1);
      piVar6 = std::istream::_M_extract<double>((double *)piVar6);
      std::istream::_M_extract<double>((double *)piVar6);
      piVar6 = std::istream::_M_extract<double>((double *)&iss1);
      piVar6 = std::istream::_M_extract<double>((double *)piVar6);
      piVar6 = std::istream::_M_extract<double>((double *)piVar6);
      std::istream::_M_extract<double>((double *)piVar6);
      iVar5 = (*(system->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x30])();
      std::__shared_ptr<chrono::ChBody,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<chrono::ChBody,void>
                ((__shared_ptr<chrono::ChBody,(__gnu_cxx::_Lock_policy)2> *)
                 &body.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>,
                 (ChBody *)CONCAT44(extraout_var,iVar5));
      std::__shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_850,&body.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>);
      (*(system->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x25])
                (system,&local_850);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_850._M_refcount);
      if (&((body.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord !=
          (ChCoordsys<double> *)&bpos) {
        ((body.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.pos.m_data[0] =
             bpos.m_data[0];
        ((body.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.pos.m_data[1] =
             bpos.m_data[1];
        ((body.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.pos.m_data[2] =
             bpos.m_data[2];
      }
      ChFrame<double>::SetRot
                ((ChFrame<double> *)
                 &(body.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_ChBodyFrame,&brot);
      (*((body.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>._vptr_ChFrame[7])
                (&(body.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_ChBodyFrame,&bpos_dt);
      (*((body.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>._vptr_ChFrame[8])
                (&(body.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_ChBodyFrame,&brot_dt);
      ((body.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_ChPhysicsItem).super_ChObj.m_identifier = bid;
      ChBody::SetBodyFixed
                (body.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 bfixed != 0);
      ChBody::SetCollide(body.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         bcollide != 0);
      ChVariablesBodyOwnMass::SetBodyMass
                (&(body.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  variables,mass);
      ChBody::SetInertiaXX
                (body.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 &inertiaXX);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&ifile,(string *)&line);
      std::__cxx11::istringstream::istringstream((istringstream *)&iss3,(string *)&line,_S_in);
      std::istream::operator>>((istringstream *)&iss3,&n_shapes);
      std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr((__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
                   &iss,&((body.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->collision_model).
                         super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                  );
      (*_iss->_vptr_ChCollisionModel[3])();
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_830);
      for (iVar5 = 0; iVar5 < n_shapes; iVar5 = iVar5 + 1) {
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&ifile,(string *)&line);
        std::__cxx11::istringstream::istringstream((istringstream *)&iss,(string *)&line,_S_in);
        spos.m_data[2] = 0.0;
        spos.m_data[0] = 0.0;
        spos.m_data[1] = 0.0;
        srot.m_data = (double  [4])(ZEXT432(0) << 0x40);
        piVar6 = std::istream::_M_extract<double>((double *)&iss);
        piVar6 = std::istream::_M_extract<double>((double *)piVar6);
        piVar6 = std::istream::_M_extract<double>((double *)piVar6);
        piVar6 = std::istream::_M_extract<double>((double *)piVar6);
        piVar6 = std::istream::_M_extract<double>((double *)piVar6);
        piVar6 = std::istream::_M_extract<double>((double *)piVar6);
        std::istream::_M_extract<double>((double *)piVar6);
        mat.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        mat.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (ctype == 0) {
          std::make_shared<chrono::ChMaterialSurfaceNSC>();
          piVar6 = std::istream::_M_extract<float>((float *)&iss);
          piVar6 = std::istream::_M_extract<float>((float *)piVar6);
          piVar6 = std::istream::_M_extract<float>((float *)piVar6);
          std::istream::_M_extract<float>((float *)piVar6);
          piVar6 = std::istream::_M_extract<float>((float *)&iss);
          piVar6 = std::istream::_M_extract<float>((float *)piVar6);
          std::istream::_M_extract<float>((float *)piVar6);
          piVar6 = std::istream::_M_extract<float>((float *)&iss);
          piVar6 = std::istream::_M_extract<float>((float *)piVar6);
          piVar6 = std::istream::_M_extract<float>((float *)piVar6);
          std::istream::_M_extract<float>((float *)piVar6);
          std::__shared_ptr<chrono::ChMaterialSurface,(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<chrono::ChMaterialSurface,(__gnu_cxx::_Lock_policy)2> *)&mat,
                     (__shared_ptr<chrono::ChMaterialSurfaceNSC,_(__gnu_cxx::_Lock_policy)2> *)
                     &matSMC);
        }
        else {
          std::make_shared<chrono::ChMaterialSurfaceSMC>();
          piVar6 = std::istream::_M_extract<float>((float *)&iss);
          std::istream::_M_extract<float>((float *)piVar6);
          piVar6 = std::istream::_M_extract<float>((float *)&iss);
          std::istream::_M_extract<float>((float *)piVar6);
          piVar6 = std::istream::_M_extract<float>((float *)&iss);
          piVar6 = std::istream::_M_extract<float>((float *)piVar6);
          std::istream::_M_extract<float>((float *)piVar6);
          piVar6 = std::istream::_M_extract<float>((float *)&iss);
          piVar6 = std::istream::_M_extract<float>((float *)piVar6);
          piVar6 = std::istream::_M_extract<float>((float *)piVar6);
          std::istream::_M_extract<float>((float *)piVar6);
          std::__shared_ptr<chrono::ChMaterialSurface,(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<chrono::ChMaterialSurface,(__gnu_cxx::_Lock_policy)2> *)&mat,
                     &matSMC.
                      super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>);
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&matSMC.
                    super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::istream::operator>>
                  ((__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
                   &iss,&stype);
        switch(stype) {
        case 0:
          std::istream::_M_extract<double>((double *)&iss);
          peVar3 = body.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_860,
                     &mat.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)
          ;
          peVar2 = matSMC.
                   super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          ChVisualMaterial::Default();
          AddSphereGeometry(peVar3,(shared_ptr<chrono::ChMaterialSurface> *)&local_860,
                            (double)peVar2,&spos,&srot,true,&local_870);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_870.
                      super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          this = &local_860._M_refcount;
          break;
        case 1:
          matSMC.super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = (element_type *)0x0;
          matSMC.super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          piVar6 = std::istream::_M_extract<double>((double *)&iss);
          piVar6 = std::istream::_M_extract<double>((double *)piVar6);
          std::istream::_M_extract<double>((double *)piVar6);
          peVar3 = body.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_880,
                     &mat.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)
          ;
          ChVisualMaterial::Default();
          AddEllipsoidGeometry
                    (peVar3,(shared_ptr<chrono::ChMaterialSurface> *)&local_880,
                     (ChVector<double> *)&matSMC,&spos,&srot,true,&local_890);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_890.
                      super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          this = &local_880._M_refcount;
          break;
        case 2:
          matSMC.super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = (element_type *)0x0;
          matSMC.super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          piVar6 = std::istream::_M_extract<double>((double *)&iss);
          piVar6 = std::istream::_M_extract<double>((double *)piVar6);
          std::istream::_M_extract<double>((double *)piVar6);
          peVar3 = body.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_8a0,
                     &mat.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)
          ;
          ChVisualMaterial::Default();
          AddBoxGeometry(peVar3,(shared_ptr<chrono::ChMaterialSurface> *)&local_8a0,
                         (ChVector<double> *)&matSMC,&spos,&srot,true,&local_8b0);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_8b0.
                      super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          this = &local_8a0._M_refcount;
          break;
        case 3:
          piVar6 = std::istream::_M_extract<double>((double *)&iss);
          piVar6 = std::istream::_M_extract<double>((double *)piVar6);
          std::istream::_M_extract<double>((double *)piVar6);
          peVar3 = body.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_8e0,
                     &mat.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)
          ;
          peVar2 = matSMC.
                   super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          ChVisualMaterial::Default();
          AddCylinderGeometry(peVar3,(shared_ptr<chrono::ChMaterialSurface> *)&local_8e0,
                              (double)peVar2,height,&spos,&srot,true,&local_8f0);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_8f0.
                      super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          this = &local_8e0._M_refcount;
          break;
        default:
          goto switchD_00e3bec6_caseD_4;
        case 10:
          piVar6 = std::istream::_M_extract<double>((double *)&iss);
          std::istream::_M_extract<double>((double *)piVar6);
          peVar3 = body.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_8c0,
                     &mat.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)
          ;
          peVar2 = matSMC.
                   super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          ChVisualMaterial::Default();
          AddCapsuleGeometry(peVar3,(shared_ptr<chrono::ChMaterialSurface> *)&local_8c0,
                             (double)peVar2,height,&spos,&srot,true,&local_8d0);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_8d0.
                      super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          this = &local_8c0._M_refcount;
          break;
        case 0xb:
          piVar6 = std::istream::_M_extract<double>((double *)&iss);
          piVar6 = std::istream::_M_extract<double>((double *)piVar6);
          std::istream::_M_extract<double>((double *)piVar6);
          peVar3 = body.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_900,
                     &mat.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)
          ;
          peVar2 = matSMC.
                   super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          ChVisualMaterial::Default();
          AddConeGeometry(peVar3,(shared_ptr<chrono::ChMaterialSurface> *)&local_900,(double)peVar2,
                          height,&spos,&srot,true,&local_910);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_910.
                      super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          this = &local_900._M_refcount;
          break;
        case 0xc:
          matSMC.super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = (element_type *)0x0;
          matSMC.super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          piVar6 = std::istream::_M_extract<double>((double *)&iss);
          piVar6 = std::istream::_M_extract<double>((double *)piVar6);
          piVar6 = std::istream::_M_extract<double>((double *)piVar6);
          std::istream::_M_extract<double>((double *)piVar6);
          peVar3 = body.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_920,
                     &mat.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)
          ;
          ChVisualMaterial::Default();
          AddRoundedBoxGeometry
                    (peVar3,(shared_ptr<chrono::ChMaterialSurface> *)&local_920,
                     (ChVector<double> *)&matSMC,height,&spos,&srot,true,&local_930);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_930.
                      super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          this = &local_920._M_refcount;
          break;
        case 0xd:
          piVar6 = std::istream::_M_extract<double>((double *)&iss);
          piVar6 = std::istream::_M_extract<double>((double *)piVar6);
          piVar6 = std::istream::_M_extract<double>((double *)piVar6);
          std::istream::_M_extract<double>((double *)piVar6);
          peVar3 = body.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_940,
                     &mat.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)
          ;
          peVar2 = matSMC.
                   super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          ChVisualMaterial::Default();
          AddRoundedCylinderGeometry
                    (peVar3,(shared_ptr<chrono::ChMaterialSurface> *)&local_940,(double)peVar2,
                     height,dummy,&spos,&srot,true,&local_950);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_950.
                      super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          this = &local_940._M_refcount;
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this);
switchD_00e3bec6_caseD_4:
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&mat.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
      }
      std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr((__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
                   &iss,&((body.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->collision_model).
                         super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                  );
      (*_iss->_vptr_ChCollisionModel[0x1f])(_iss,(ulong)(uint)(int)family_group);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_830);
      std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr((__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
                   &iss,&((body.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->collision_model).
                         super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                  );
      (*_iss->_vptr_ChCollisionModel[0x21])(_iss,(ulong)(uint)(int)family_mask);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_830);
      std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr((__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
                   &iss,&((body.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->collision_model).
                         super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                  );
      (*_iss->_vptr_ChCollisionModel[4])();
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_830);
      std::__cxx11::istringstream::~istringstream((istringstream *)&iss3);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&body.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__cxx11::istringstream::~istringstream((istringstream *)&iss1);
    }
  }
  else {
    std::operator<<((ostream *)&std::cout,
                    "utils::ReadCheckpoint ERROR: checkpoint data file inconsistent with the Chrono system\n"
                   );
    poVar8 = std::operator<<((ostream *)&std::cout,"    Contact method in data file: ");
    pcVar1 = "ChMaterialSurfaceSMC";
    if (ctype == 0) {
      pcVar1 = "ChMaterialSurfaceNSC";
    }
    poVar8 = std::operator<<(poVar8,pcVar1 + 0x11);
    std::operator<<(poVar8,"\n");
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)&iss0);
  std::__cxx11::string::~string((string *)&line);
  std::ifstream::~ifstream(&ifile);
  return;
}

Assistant:

void ReadCheckpoint(ChSystem* system, const std::string& filename) {
    // Open input file stream
    std::ifstream ifile(filename.c_str());
    std::string line;

    // Read the contact method type
    std::getline(ifile, line);
    std::istringstream iss0(line);
    int ctype;
    iss0 >> ctype;
    auto contact_method = (ctype == 0) ? ChContactMethod::NSC : ChContactMethod::SMC;

    // Check consistency with the current system
    if (contact_method != system->GetContactMethod()) {
        std::cout << "utils::ReadCheckpoint ERROR: checkpoint data file inconsistent with the Chrono system\n";
        std::cout << "    Contact method in data file: " << (ctype == 0 ? "NSC" : "SMC") << "\n";
        return;
    }

    while (std::getline(ifile, line)) {
        std::istringstream iss1(line);

        // Read body Id and flags
        int bid, bfixed, bcollide;
        short family_group, family_mask;
        iss1 >> bid >> bfixed >> bcollide >> family_group >> family_mask;

        // Read body mass and inertia
        double mass;
        ChVector<> inertiaXX;
        iss1 >> mass >> inertiaXX.x() >> inertiaXX.y() >> inertiaXX.z();

        // Read body position, orientation, and their time derivatives
        ChVector<> bpos, bpos_dt;
        ChQuaternion<> brot, brot_dt;
        iss1 >> bpos.x() >> bpos.y() >> bpos.z();
        iss1 >> brot.e0() >> brot.e1() >> brot.e2() >> brot.e3();
        iss1 >> bpos_dt.x() >> bpos_dt.y() >> bpos_dt.z();
        iss1 >> brot_dt.e0() >> brot_dt.e1() >> brot_dt.e2() >> brot_dt.e3();

        // Create a body of the appropriate type
        auto body = std::shared_ptr<ChBody>(system->NewBody());
        system->AddBody(body);

        // Set body properties and state
        body->SetPos(bpos);
        body->SetRot(brot);
        body->SetPos_dt(bpos_dt);
        body->SetRot_dt(brot_dt);

        body->SetIdentifier(bid);
        body->SetBodyFixed(bfixed != 0);
        body->SetCollide(bcollide != 0);

        body->SetMass(mass);
        body->SetInertiaXX(inertiaXX);

        // Get next line in the file (number of collision shapes)
        std::getline(ifile, line);
        std::istringstream iss3(line);

        int n_shapes;
        iss3 >> n_shapes;

        // In a loop, read information about each shape and add geometry to the body
        body->GetCollisionModel()->ClearModel();

        for (int j = 0; j < n_shapes; j++) {
            std::getline(ifile, line);
            std::istringstream iss(line);

            // Get shape relative position and rotation
            ChVector<> spos;
            ChQuaternion<> srot;
            iss >> spos.x() >> spos.y() >> spos.z() >> srot.e0() >> srot.e1() >> srot.e2() >> srot.e3();

            // Get material information and create the material
            std::shared_ptr<ChMaterialSurface> mat;
            if (ctype == 0) {
                auto matNSC = chrono_types::make_shared<ChMaterialSurfaceNSC>();
                iss >> matNSC->static_friction >> matNSC->sliding_friction >> matNSC->rolling_friction >>
                    matNSC->spinning_friction;
                iss >> matNSC->restitution >> matNSC->cohesion >> matNSC->dampingf;
                iss >> matNSC->compliance >> matNSC->complianceT >> matNSC->complianceRoll >> matNSC->complianceSpin;
                mat = matNSC;
            } else {
                auto matSMC = chrono_types::make_shared<ChMaterialSurfaceSMC>();
                iss >> matSMC->young_modulus >> matSMC->poisson_ratio;
                iss >> matSMC->static_friction >> matSMC->sliding_friction;
                iss >> matSMC->restitution >> matSMC->constant_adhesion >> matSMC->adhesionMultDMT;
                iss >> matSMC->kn >> matSMC->gn >> matSMC->kt >> matSMC->gt;
                mat = matSMC;
            }

            // Get shape type and geometry data and create the shape (both visualization and contact).
            int stype;
            iss >> stype;

            switch (collision::ChCollisionShape::Type(stype)) {
                case collision::ChCollisionShape::Type::SPHERE: {
                    double radius;
                    iss >> radius;
                    AddSphereGeometry(body.get(), mat, radius, spos, srot);
                } break;
                case collision::ChCollisionShape::Type::ELLIPSOID: {
                    ChVector<> size;
                    iss >> size.x() >> size.y() >> size.z();
                    AddEllipsoidGeometry(body.get(), mat, size, spos, srot);
                } break;
                case collision::ChCollisionShape::Type::BOX: {
                    ChVector<> size;
                    iss >> size.x() >> size.y() >> size.z();
                    AddBoxGeometry(body.get(), mat, size, spos, srot);
                } break;
                case collision::ChCollisionShape::Type::CAPSULE: {
                    double radius, hlen;
                    iss >> radius >> hlen;
                    AddCapsuleGeometry(body.get(), mat, radius, hlen, spos, srot);
                } break;
                case collision::ChCollisionShape::Type::CYLINDER: {
                    double radius, hlen, dummy;
                    iss >> radius >> dummy >> hlen;
                    AddCylinderGeometry(body.get(), mat, radius, hlen, spos, srot);
                } break;
                case collision::ChCollisionShape::Type::CONE: {
                    double radius, height, dummy;
                    iss >> radius >> dummy >> height;
                    AddConeGeometry(body.get(), mat, radius, height, spos, srot);
                } break;
                case collision::ChCollisionShape::Type::ROUNDEDBOX: {
                    ChVector<> size;
                    double srad;
                    iss >> size.x() >> size.y() >> size.z() >> srad;
                    AddRoundedBoxGeometry(body.get(), mat, size, srad, spos, srot);
                } break;
                case collision::ChCollisionShape::Type::ROUNDEDCYL: {
                    double radius, hlen, srad, dummy;
                    iss >> radius >> dummy >> hlen >> srad;
                    AddRoundedCylinderGeometry(body.get(), mat, radius, hlen, srad, spos, srot);
                } break;
                default:
                    break;
            }
        }

        // Set the collision family group and the collision family mask.
        body->GetCollisionModel()->SetFamilyGroup(family_group);
        body->GetCollisionModel()->SetFamilyMask(family_mask);

        // Complete construction of the collision model.
        body->GetCollisionModel()->BuildModel();
    }
}